

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::saveStreamableParameters
               (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  undefined8 uVar1;
  element_type *peVar2;
  byte in_DL;
  _Ios_Openmode in_ESI;
  exception *ex;
  GenericException *ex_1;
  ofstream out;
  CFeatureBag bag;
  bool ret;
  long local_238 [60];
  CFeatureBag *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  CFeatureBag local_28 [22];
  byte local_12;
  byte local_11;
  _Ios_Openmode local_10;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  local_10 = in_ESI;
  GenApi_3_4::CFeatureBag::CFeatureBag(local_28);
  peVar2 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x163e86);
  GenApi_3_4::CFeatureBag::StoreToBag
            ((INodeMap *)local_28,
             (int)(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
             (gcstring_vector *)0xffffffff);
  std::ofstream::ofstream(local_238);
  uVar1 = *(undefined8 *)(local_238[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_238 + (int)uVar1);
  std::ofstream::open((char *)local_238,local_10);
  GenApi_3_4::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::ofstream::close();
  local_12 = 1;
  std::ofstream::~ofstream(local_238);
  GenApi_3_4::CFeatureBag::~CFeatureBag(local_28);
  return (bool)(local_12 & 1);
}

Assistant:

bool saveStreamableParameters(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  bool exception)
{
  bool ret=false;

  try
  {
    GenApi::CFeatureBag bag;

    bag.StoreToBag(nodemap->_Ptr);

    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    out.open(name);
    out << bag;
    out.close();

    ret=true;
  }
  catch (const std::exception &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}